

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgenfil.cpp
# Opt level: O1

void __thiscall CTcDataStream::write_to_object_file(CTcDataStream *this,CVmFile *fp)

{
  uint32_t tmp;
  ulong uVar1;
  CTcSymbol *pCVar2;
  CTcStreamAnchor *pCVar3;
  char *buf_00;
  size_t sVar4;
  ulong uVar5;
  char buf [6];
  char b [4];
  char b_1 [4];
  undefined4 local_40;
  undefined2 local_3c;
  undefined4 local_38;
  int local_34;
  
  local_38 = (undefined4)this->ofs_;
  CVmFile::write_bytes(fp,(char *)&local_38,4);
  uVar1 = this->ofs_;
  if (uVar1 != 0) {
    uVar5 = 0;
    do {
      sVar4 = uVar1 - uVar5;
      if (uVar5 + 65000 <= uVar1) {
        sVar4 = 65000;
      }
      CVmFile::write_bytes(fp,this->pages_[uVar5 / 65000] + uVar5 % 65000,sVar4);
      uVar5 = uVar5 + sVar4;
      uVar1 = this->ofs_;
    } while (uVar5 < uVar1);
  }
  local_34 = -1;
  pCVar3 = (CTcStreamAnchor *)&this->first_anchor_;
  do {
    pCVar3 = pCVar3->nxt_;
    local_34 = local_34 + 1;
  } while (pCVar3 != (CTcStreamAnchor *)0x0);
  CVmFile::write_bytes(fp,(char *)&local_34,4);
  pCVar3 = this->first_anchor_;
  if (pCVar3 != (CTcStreamAnchor *)0x0) {
    do {
      local_40 = (undefined4)pCVar3->ofs_;
      if ((pCVar3->fixup_info_).fixup_owner_sym_ == (CTcSymbol *)0x0 ||
          (anon_union_8_2_4a88f83c_for_fixup_info_ *)pCVar3->fixup_list_head_ ==
          &pCVar3->fixup_info_) {
        local_3c = 0;
        sVar4 = 6;
        buf_00 = (char *)&local_40;
      }
      else {
        local_3c = (undefined2)
                   (((pCVar3->fixup_info_).fixup_owner_sym_)->super_CTcSymbolBase).
                   super_CVmHashEntryCS.super_CVmHashEntry.len_;
        CVmFile::write_bytes(fp,(char *)&local_40,6);
        if ((anon_union_8_2_4a88f83c_for_fixup_info_ *)pCVar3->fixup_list_head_ ==
            &pCVar3->fixup_info_) {
          pCVar2 = (CTcSymbol *)0x0;
        }
        else {
          pCVar2 = (pCVar3->fixup_info_).fixup_owner_sym_;
        }
        buf_00 = (pCVar2->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.str_;
        sVar4 = (pCVar2->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.len_;
      }
      CVmFile::write_bytes(fp,buf_00,sVar4);
      CTcAbsFixup::write_fixup_list_to_object_file(fp,*pCVar3->fixup_list_head_);
      pCVar3 = pCVar3->nxt_;
    } while (pCVar3 != (CTcStreamAnchor *)0x0);
  }
  return;
}

Assistant:

void CTcDataStream::write_to_object_file(CVmFile *fp)
{
    ulong ofs;
    CTcStreamAnchor *anchor;
    long cnt;

    /* 
     *   First, write the data stream bytes.  Write the length prefix
     *   followed by the data.  Just blast the whole thing out in one huge
     *   byte stream, one page at a time.  
     */
    fp->write_uint4(ofs_);

    /* write the data one page at a time */
    for (ofs = 0 ; ofs < ofs_ ; )
    {
        size_t cur;

        /* 
         *   write out one whole page, or the balance of the current page if
         *   we have less than a whole page remaining 
         */
        cur = TCCS_PAGE_SIZE;
        if (ofs + cur > ofs_)
            cur = (size_t)(ofs_ - ofs);

        /* write out this chunk */
        fp->write_bytes(calc_addr(ofs), cur);

        /* move to the next page's offset */
        ofs += cur;
    }

    /* count the anchors */
    for (cnt = 0, anchor = first_anchor_ ; anchor != 0 ;
         anchor = anchor->nxt_, ++cnt) ;

    /* write the count */
    fp->write_uint4(cnt);

    /*
     *   Write all of the anchors, and all of their fixups.  (We have the
     *   code to write the anchor and fixup information in-line here for
     *   efficiency - there will normally be a large number of these tiny
     *   objects, so anything we can do to improve the speed of this loop
     *   will help quite a lot in the overall write performance.)  
     */
    for (anchor = first_anchor_ ; anchor != 0 ; anchor = anchor->nxt_)
    {
        char buf[6];

        /* write the stream offset */
        oswp4(buf, anchor->get_ofs());

        /* 
         *   If the anchor has an external fixup list, write the symbol's
         *   name to the file; otherwise write a zero length to indicate that
         *   we have an internal fixup list.  
         */
        if (anchor->get_fixup_owner_sym() == 0)
        {
            /* no external list - indicate with a zero symbol length */
            oswp2(buf+4, 0);
            fp->write_bytes(buf, 6);
        }
        else
        {
            /* external list - write the symbol length and name */
            oswp2(buf+4, anchor->get_fixup_owner_sym()->get_sym_len());
            fp->write_bytes(buf, 6);
            fp->write_bytes(anchor->get_fixup_owner_sym()->get_sym(),
                            anchor->get_fixup_owner_sym()->get_sym_len());
        }

        /* write the fixup list */
        CTcAbsFixup::
            write_fixup_list_to_object_file(fp, *anchor->fixup_list_head_);
    }
}